

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecognitionException.cpp
# Opt level: O0

void __thiscall
antlr::RecognitionException::RecognitionException
          (RecognitionException *this,string *s,string *fileName_,int line_,int column_)

{
  undefined4 in_ECX;
  string *in_RDX;
  string *in_RDI;
  undefined4 in_R8D;
  ANTLRException *in_stack_ffffffffffffffd0;
  
  ANTLRException::ANTLRException(in_stack_ffffffffffffffd0,in_RDI);
  *(undefined ***)in_RDI = &PTR__RecognitionException_0034afa0;
  std::__cxx11::string::string((string *)&in_RDI[1]._M_string_length,in_RDX);
  *(undefined4 *)&in_RDI[2]._M_string_length = in_ECX;
  *(undefined4 *)((long)&in_RDI[2]._M_string_length + 4) = in_R8D;
  return;
}

Assistant:

RecognitionException::RecognitionException(const ANTLR_USE_NAMESPACE(std)string& s,
                                           const ANTLR_USE_NAMESPACE(std)string& fileName_,
                                           int line_,int column_)
: ANTLRException(s)
, fileName(fileName_)
, line(line_)
, column(column_)
{
}